

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

Request<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
* __thiscall
capnproto_test::capnp::test::TestMembrane::Client::callPassThroughRequest
          (Request<capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Request<capnp::AnyPointer,_capnp::AnyPointer> typeless;
  SegmentBuilder *local_a0;
  CapTableBuilder *pCStack_98;
  WirePointer *local_90;
  Disposer *local_88;
  RequestHook *local_80;
  uint64_t local_78;
  undefined8 uStack_70;
  char local_68 [8];
  uint64_t local_60;
  undefined8 uStack_58;
  StructBuilder local_50;
  PointerBuilder local_28;
  
  local_68[0] = (sizeHint->ptr).isSet;
  if ((bool)local_68[0] == true) {
    local_78 = (sizeHint->ptr).field_1.value.wordCount;
    uStack_70 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  if ((bool)local_68[0] != false) {
    local_60 = local_78;
    uStack_58 = uStack_70;
  }
  (**(code **)**(undefined8 **)(this + *(long *)(*(long *)this + -0x18) + 8))
            (&local_a0,*(undefined8 **)(this + *(long *)(*(long *)this + -0x18) + 8),
             0xc07d8dcd80a69c0c,1,local_68,1);
  local_28.pointer = local_90;
  local_28.segment = local_a0;
  local_28.capTable = pCStack_98;
  ::capnp::_::PointerBuilder::getStruct(&local_50,&local_28,(StructSize)0x10001,(word *)0x0);
  (__return_storage_ptr__->super_Builder)._builder.dataSize = local_50.dataSize;
  (__return_storage_ptr__->super_Builder)._builder.pointerCount = local_50.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->super_Builder)._builder.field_0x26 = local_50._38_2_;
  (__return_storage_ptr__->super_Builder)._builder.data = local_50.data;
  (__return_storage_ptr__->super_Builder)._builder.pointers = local_50.pointers;
  (__return_storage_ptr__->super_Builder)._builder.segment = local_50.segment;
  (__return_storage_ptr__->super_Builder)._builder.capTable = local_50.capTable;
  (__return_storage_ptr__->hook).disposer = local_88;
  (__return_storage_ptr__->hook).ptr = local_80;
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>
TestMembrane::Client::callPassThroughRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMembrane::CallPassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(
      0xc07d8dcd80a69c0cull, 1, sizeHint, {true});
}